

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O1

void __thiscall ON_CurvePipingUserData::SetToDefaults(ON_CurvePipingUserData *this)

{
  int iVar1;
  undefined4 extraout_var;
  ON_XMLNode *pOVar2;
  ON_XMLParameters p;
  ON_XMLProperty prop;
  ON_XMLParameters local_180;
  ON_XMLVariant local_170;
  ON_XMLProperty local_78;
  
  (*(this->super_ON_XMLUserData).super_ON_UserData.super_ON_Object._vptr_ON_Object[0x24])();
  ON_XMLProperty::ON_XMLProperty(&local_78);
  iVar1 = (*(this->super_ON_XMLUserData).super_ON_UserData.super_ON_Object._vptr_ON_Object[0x1f])
                    (this);
  pOVar2 = (ON_XMLNode *)operator_new(0xe8);
  ON_XMLNode::ON_XMLNode(pOVar2,L"curve-piping-object-data");
  pOVar2 = (ON_XMLNode *)
           (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x58))
                     ((long *)CONCAT44(extraout_var,iVar1),pOVar2);
  ON_XMLParameters::ON_XMLParameters(&local_180,pOVar2);
  ::ON_XMLVariant::ON_XMLVariant(&local_170,false);
  ON_XMLParameters::SetParam(&local_180,L"on",&local_170);
  ::ON_XMLVariant::~ON_XMLVariant(&local_170);
  ::ON_XMLVariant::ON_XMLVariant(&local_170,1.0);
  ON_XMLParameters::SetParam(&local_180,L"radius",&local_170);
  ::ON_XMLVariant::~ON_XMLVariant(&local_170);
  ::ON_XMLVariant::ON_XMLVariant(&local_170,0x10);
  ON_XMLParameters::SetParam(&local_180,L"segments",&local_170);
  ::ON_XMLVariant::~ON_XMLVariant(&local_170);
  ::ON_XMLVariant::ON_XMLVariant(&local_170,0x32);
  ON_XMLParameters::SetParam(&local_180,L"accuracy",&local_170);
  ::ON_XMLVariant::~ON_XMLVariant(&local_170);
  ::ON_XMLVariant::ON_XMLVariant(&local_170,true);
  ON_XMLParameters::SetParam(&local_180,L"weld",&local_170);
  ::ON_XMLVariant::~ON_XMLVariant(&local_170);
  ::ON_XMLVariant::ON_XMLVariant(&local_170,L"dome");
  ON_XMLParameters::SetParam(&local_180,L"cap-type",&local_170);
  ::ON_XMLVariant::~ON_XMLVariant(&local_170);
  ON_XMLParameters::~ON_XMLParameters(&local_180);
  ON_XMLProperty::~ON_XMLProperty(&local_78);
  return;
}

Assistant:

void ON_CurvePipingUserData::SetToDefaults(void) const
{
  auto& ud = const_cast<ON_CurvePipingUserData&>(*this);
  ud.Clear();

  ON_XMLProperty prop;
  ON_XMLNode* root = ud.XMLRootForWrite().AttachChildNode(new ON_XMLNode(ON_CURVE_PIPING_ROOT));

  ON_CurvePiping::Defaults d;

  ON_XMLParameters p(*root);
  p.SetParam(ON_CURVE_PIPING_ON, false);
  p.SetParam(ON_CURVE_PIPING_RADIUS, d.Radius());
  p.SetParam(ON_CURVE_PIPING_SEGMENTS, d.Segments());
  p.SetParam(ON_CURVE_PIPING_ACCURACY, d.Accuracy());
  p.SetParam(ON_CURVE_PIPING_WELD, !d.Faceted()); // 'Weld' is the inverse of 'Faceted'.
  p.SetParam(ON_CURVE_PIPING_CAP_TYPE, L"dome");
}